

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * c4::yml::allocate_impl(size_t length,void *param_2,void *param_3)

{
  Location loc;
  void *pvVar1;
  undefined8 in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  char msg [26];
  void *mem;
  Location *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffffb0;
  size_t length_00;
  char *msg_00;
  undefined2 uVar2;
  undefined1 in_stack_ffffffffffffffd2 [14];
  
  pvVar1 = malloc(in_RDI);
  if (pvVar1 == (void *)0x0) {
    length_00._0_1_ = 'c';
    length_00._1_1_ = 'o';
    length_00._2_1_ = 'u';
    length_00._3_1_ = 'l';
    length_00._4_1_ = 'd';
    length_00._5_1_ = ' ';
    length_00._6_1_ = 'n';
    length_00._7_1_ = 'o';
    msg_00 = (char *)0x61636f6c6c612074;
    uVar2 = 0x79;
    Location::Location(in_stack_ffffffffffffff60);
    loc.super_LineCol._2_14_ = in_stack_ffffffffffffffd2;
    loc.super_LineCol.offset._0_2_ = uVar2;
    loc.super_LineCol.col = (size_t)pvVar1;
    loc.name.str = (char *)in_RDX;
    loc.name.len = in_RSI;
    error_impl(msg_00,length_00,loc,in_stack_ffffffffffffffb0);
  }
  return pvVar1;
}

Assistant:

void* allocate_impl(size_t length, void * /*hint*/, void * /*user_data*/)
{
    void *mem = ::malloc(length);
    if(mem == nullptr)
    {
        const char msg[] = "could not allocate memory";
        error_impl(msg, sizeof(msg)-1, {}, nullptr);
    }
    return mem;
}